

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_dc(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  int local_44;
  int local_40;
  int j;
  int i;
  int dc;
  u16 avail_cu_local;
  int h_local;
  int w_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  
  j = 0;
  dc = h;
  _w_local = dst;
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      j._0_2_ = (short)(1 << ((char)bit_depth - 1U & 0x1f));
    }
    else {
      for (local_44 = 0; local_44 < w; local_44 = local_44 + 1) {
        j = (uint)src[local_44 + 1] + j;
      }
      j._0_2_ = (short)(j + (w >> 1) >> (g_tbl_log2[w] & 0x1fU));
    }
  }
  else {
    for (local_40 = 0; local_40 < h; local_40 = local_40 + 1) {
      j = (uint)src[-1 - local_40] + j;
    }
    if ((avail_cu & 1) == 0) {
      j._0_2_ = (short)(j + (h >> 1) >> (g_tbl_log2[h] & 0x1fU));
    }
    else {
      for (local_44 = 0; local_44 < w; local_44 = local_44 + 1) {
        j = (uint)src[local_44 + 1] + j;
      }
      j._0_2_ = (short)((j + (w + h >> 1)) * (int)(0x1000 / (long)(w + h)) >> 0xc);
    }
  }
  while (dc != 0) {
    memset(_w_local,(int)(short)j & 0xff,(long)w);
    _w_local = _w_local + i_dst;
    dc = dc + -1;
  }
  return;
}

Assistant:

void ipred_dc(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc = 0;
    int i, j;
    if(IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h; i++) {
            dc += src[-i-1];
        }
        if(IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w; j++) {
                dc += src[j+1];
            }
            dc = (dc + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc = (dc + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if(IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w; j++) {
            dc += src[j+1];
        }
        dc = (dc + (w >> 1)) >> g_tbl_log2[w];
    } else {     
        dc = 1 << (bit_depth - 1);
    }

    while(h--) {
        com_mset_pel(dst, dc, w);
        dst += i_dst;
    }
}